

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Dialog::~Dialog(Dialog *this)

{
  long in_RDI;
  
  *(undefined8 *)(in_RDI + 8) = 0;
  al_destroy_event_queue(*(undefined8 *)(in_RDI + 0x10));
  *(undefined8 *)(in_RDI + 0x10) = 0;
  std::__cxx11::list<Widget_*,_std::allocator<Widget_*>_>::~list
            ((list<Widget_*,_std::allocator<Widget_*>_> *)0x10d87c);
  return;
}

Assistant:

Dialog::~Dialog()
{
   this->display = NULL;

   al_destroy_event_queue(this->event_queue);
   this->event_queue = NULL;
}